

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MFInterpolater.cpp
# Opt level: O0

Box * __thiscall
amrex::MFCellConsLinInterp::CoarseBox(MFCellConsLinInterp *this,Box *fine,int ratio)

{
  int in_ECX;
  int iVar1;
  undefined8 *in_RDX;
  Box *in_RDI;
  bool bVar2;
  Box *crse;
  int dir;
  IntVect off;
  int local_264;
  int local_260;
  int local_25c;
  int local_254;
  int local_250;
  int local_24c;
  int local_244;
  int local_240;
  int local_23c;
  int local_22c;
  int local_228;
  int local_224;
  int local_21c;
  int local_218;
  int local_214;
  int local_20c;
  int local_208;
  int local_204;
  int local_1f4;
  int local_1f0;
  int local_1ec;
  int local_1e4;
  int local_1e0;
  int local_1dc;
  int local_1d4;
  int local_1d0;
  int local_1cc;
  IntVect local_180 [2];
  int local_168;
  IntVect local_164;
  IntVect *local_158;
  int local_144;
  IntVect *local_140;
  undefined4 local_134;
  IntVect *local_130;
  IntVect *local_128;
  IntVect *local_120;
  IntVect *local_118;
  IntVect *local_110;
  IntVect *local_108;
  IndexType *local_f8;
  int local_ec;
  IndexType *local_e8;
  int local_dc;
  IntVect *local_d8;
  undefined4 local_d0;
  int local_cc;
  IntVect *local_c8;
  IntVect *local_c0;
  IntVect *local_b8;
  undefined4 local_ac;
  IntVect *local_a8;
  undefined4 local_9c;
  IntVect *local_98;
  undefined4 local_8c;
  IntVect *local_88;
  int local_7c;
  int local_78;
  int local_70;
  int local_6c;
  int local_64;
  int local_60;
  int local_58;
  int local_54;
  int local_4c;
  int local_48;
  int local_40;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  int local_28;
  int local_24;
  int local_20;
  int local_1c;
  int local_18;
  int local_14;
  IndexType *local_10;
  int local_4;
  
  *(undefined8 *)(in_RDI->smallend).vect = *in_RDX;
  *(undefined8 *)((in_RDI->smallend).vect + 2) = in_RDX[1];
  *(undefined8 *)((in_RDI->bigend).vect + 1) = in_RDX[2];
  (in_RDI->btype).itype = *(uint *)(in_RDX + 3);
  IntVect::IntVect(local_180,in_ECX);
  local_158 = local_180;
  local_134 = 1;
  bVar2 = true;
  if ((local_180[0].vect[0] == 1) && (bVar2 = true, local_180[0].vect[1] == 1)) {
    bVar2 = local_180[0].vect[2] != 1;
  }
  local_130 = local_158;
  if (bVar2) {
    local_64 = (in_RDI->smallend).vect[0];
    local_60 = local_64;
    if (local_180[0].vect[0] != 1) {
      if (local_180[0].vect[0] == 2) {
        if (local_64 < 0) {
          iVar1 = local_64 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1cc = -iVar1 / 2 + -1;
        }
        else {
          local_1cc = local_64 / 2;
        }
        local_60 = local_1cc;
      }
      else if (local_180[0].vect[0] == 4) {
        if (local_64 < 0) {
          iVar1 = local_64 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1d0 = -iVar1 / 4 + -1;
        }
        else {
          local_1d0 = local_64 / 4;
        }
        local_60 = local_1d0;
      }
      else {
        if (local_64 < 0) {
          iVar1 = local_64 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1d4 = -iVar1 / local_180[0].vect[0] + -1;
        }
        else {
          local_1d4 = local_64 / local_180[0].vect[0];
        }
        local_60 = local_1d4;
      }
    }
    (in_RDI->smallend).vect[0] = local_60;
    local_70 = (in_RDI->smallend).vect[1];
    local_6c = local_70;
    if (local_180[0].vect[1] != 1) {
      if (local_180[0].vect[1] == 2) {
        if (local_70 < 0) {
          iVar1 = local_70 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1dc = -iVar1 / 2 + -1;
        }
        else {
          local_1dc = local_70 / 2;
        }
        local_6c = local_1dc;
      }
      else if (local_180[0].vect[1] == 4) {
        if (local_70 < 0) {
          iVar1 = local_70 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1e0 = -iVar1 / 4 + -1;
        }
        else {
          local_1e0 = local_70 / 4;
        }
        local_6c = local_1e0;
      }
      else {
        if (local_70 < 0) {
          iVar1 = local_70 + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1e4 = -iVar1 / local_180[0].vect[1] + -1;
        }
        else {
          local_1e4 = local_70 / local_180[0].vect[1];
        }
        local_6c = local_1e4;
      }
    }
    (in_RDI->smallend).vect[1] = local_6c;
    local_7c = (in_RDI->smallend).vect[2];
    local_78 = local_7c;
    if (local_180[0].vect[2] != 1) {
      if (local_180[0].vect[2] == 2) {
        if (local_7c < 0) {
          iVar1 = local_7c + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1ec = -iVar1 / 2 + -1;
        }
        else {
          local_1ec = local_7c / 2;
        }
        local_78 = local_1ec;
      }
      else if (local_180[0].vect[2] == 4) {
        if (local_7c < 0) {
          iVar1 = local_7c + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1f0 = -iVar1 / 4 + -1;
        }
        else {
          local_1f0 = local_7c / 4;
        }
        local_78 = local_1f0;
      }
      else {
        if (local_7c < 0) {
          iVar1 = local_7c + 1;
          if (iVar1 < 1) {
            iVar1 = -iVar1;
          }
          local_1f4 = -iVar1 / local_180[0].vect[2] + -1;
        }
        else {
          local_1f4 = local_7c / local_180[0].vect[2];
        }
        local_78 = local_1f4;
      }
    }
    (in_RDI->smallend).vect[2] = local_78;
    local_f8 = &in_RDI->btype;
    local_108 = local_158;
    if (local_f8->itype == 0) {
      local_110 = &in_RDI->bigend;
      local_40 = local_110->vect[0];
      local_3c = local_40;
      if (local_180[0].vect[0] != 1) {
        if (local_180[0].vect[0] == 2) {
          if (local_40 < 0) {
            iVar1 = local_40 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_23c = -iVar1 / 2 + -1;
          }
          else {
            local_23c = local_40 / 2;
          }
          local_3c = local_23c;
        }
        else if (local_180[0].vect[0] == 4) {
          if (local_40 < 0) {
            iVar1 = local_40 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_240 = -iVar1 / 4 + -1;
          }
          else {
            local_240 = local_40 / 4;
          }
          local_3c = local_240;
        }
        else {
          if (local_40 < 0) {
            iVar1 = local_40 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_244 = -iVar1 / local_180[0].vect[0] + -1;
          }
          else {
            local_244 = local_40 / local_180[0].vect[0];
          }
          local_3c = local_244;
        }
      }
      local_110->vect[0] = local_3c;
      local_4c = (in_RDI->bigend).vect[1];
      local_48 = local_4c;
      if (local_180[0].vect[1] != 1) {
        if (local_180[0].vect[1] == 2) {
          if (local_4c < 0) {
            iVar1 = local_4c + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_24c = -iVar1 / 2 + -1;
          }
          else {
            local_24c = local_4c / 2;
          }
          local_48 = local_24c;
        }
        else if (local_180[0].vect[1] == 4) {
          if (local_4c < 0) {
            iVar1 = local_4c + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_250 = -iVar1 / 4 + -1;
          }
          else {
            local_250 = local_4c / 4;
          }
          local_48 = local_250;
        }
        else {
          if (local_4c < 0) {
            iVar1 = local_4c + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_254 = -iVar1 / local_180[0].vect[1] + -1;
          }
          else {
            local_254 = local_4c / local_180[0].vect[1];
          }
          local_48 = local_254;
        }
      }
      (in_RDI->bigend).vect[1] = local_48;
      local_58 = (in_RDI->bigend).vect[2];
      local_54 = local_58;
      if (local_180[0].vect[2] != 1) {
        if (local_180[0].vect[2] == 2) {
          if (local_58 < 0) {
            iVar1 = local_58 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_25c = -iVar1 / 2 + -1;
          }
          else {
            local_25c = local_58 / 2;
          }
          local_54 = local_25c;
        }
        else if (local_180[0].vect[2] == 4) {
          if (local_58 < 0) {
            iVar1 = local_58 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_260 = -iVar1 / 4 + -1;
          }
          else {
            local_260 = local_58 / 4;
          }
          local_54 = local_260;
        }
        else {
          if (local_58 < 0) {
            iVar1 = local_58 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_264 = -iVar1 / local_180[0].vect[2] + -1;
          }
          else {
            local_264 = local_58 / local_180[0].vect[2];
          }
          local_54 = local_264;
        }
      }
      (in_RDI->bigend).vect[2] = local_54;
      local_118 = local_158;
    }
    else {
      IntVect::IntVect(&local_164,0);
      for (local_168 = 0; local_168 < 3; local_168 = local_168 + 1) {
        local_e8 = &in_RDI->btype;
        local_ec = local_168;
        local_14 = local_168;
        local_4 = local_168;
        if ((local_e8->itype & 1 << ((byte)local_168 & 0x1f)) != 0) {
          local_d8 = &in_RDI->bigend;
          local_dc = local_168;
          local_140 = local_158;
          local_144 = local_168;
          if (local_d8->vect[local_168] % local_158->vect[local_168] != 0) {
            local_c8 = &local_164;
            local_cc = local_168;
            local_d0 = 1;
            local_c8->vect[local_168] = 1;
          }
        }
        local_10 = local_e8;
      }
      local_120 = &in_RDI->bigend;
      local_128 = local_158;
      local_1c = local_120->vect[0];
      local_20 = local_158->vect[0];
      local_18 = local_1c;
      if (local_20 != 1) {
        if (local_20 == 2) {
          if (local_1c < 0) {
            iVar1 = local_1c + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_204 = -iVar1 / 2 + -1;
          }
          else {
            local_204 = local_1c / 2;
          }
          local_18 = local_204;
        }
        else if (local_20 == 4) {
          if (local_1c < 0) {
            iVar1 = local_1c + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_208 = -iVar1 / 4 + -1;
          }
          else {
            local_208 = local_1c / 4;
          }
          local_18 = local_208;
        }
        else {
          if (local_1c < 0) {
            iVar1 = local_1c + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_20c = -iVar1 / local_20 + -1;
          }
          else {
            local_20c = local_1c / local_20;
          }
          local_18 = local_20c;
        }
      }
      local_120->vect[0] = local_18;
      local_28 = (in_RDI->bigend).vect[1];
      local_2c = local_158->vect[1];
      local_24 = local_28;
      if (local_2c != 1) {
        if (local_2c == 2) {
          if (local_28 < 0) {
            iVar1 = local_28 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_214 = -iVar1 / 2 + -1;
          }
          else {
            local_214 = local_28 / 2;
          }
          local_24 = local_214;
        }
        else if (local_2c == 4) {
          if (local_28 < 0) {
            iVar1 = local_28 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_218 = -iVar1 / 4 + -1;
          }
          else {
            local_218 = local_28 / 4;
          }
          local_24 = local_218;
        }
        else {
          if (local_28 < 0) {
            iVar1 = local_28 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_21c = -iVar1 / local_2c + -1;
          }
          else {
            local_21c = local_28 / local_2c;
          }
          local_24 = local_21c;
        }
      }
      (in_RDI->bigend).vect[1] = local_24;
      local_34 = (in_RDI->bigend).vect[2];
      local_38 = local_158->vect[2];
      local_30 = local_34;
      if (local_38 != 1) {
        if (local_38 == 2) {
          if (local_34 < 0) {
            iVar1 = local_34 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_224 = -iVar1 / 2 + -1;
          }
          else {
            local_224 = local_34 / 2;
          }
          local_30 = local_224;
        }
        else if (local_38 == 4) {
          if (local_34 < 0) {
            iVar1 = local_34 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_228 = -iVar1 / 4 + -1;
          }
          else {
            local_228 = local_34 / 4;
          }
          local_30 = local_228;
        }
        else {
          if (local_34 < 0) {
            iVar1 = local_34 + 1;
            if (iVar1 < 1) {
              iVar1 = -iVar1;
            }
            local_22c = -iVar1 / local_38 + -1;
          }
          else {
            local_22c = local_34 / local_38;
          }
          local_30 = local_22c;
        }
      }
      (in_RDI->bigend).vect[2] = local_30;
      local_b8 = &in_RDI->bigend;
      local_c0 = &local_164;
      local_8c = 0;
      local_b8->vect[0] = local_164.vect[0] + local_b8->vect[0];
      local_9c = 1;
      (in_RDI->bigend).vect[1] = local_164.vect[1] + (in_RDI->bigend).vect[1];
      local_ac = 2;
      (in_RDI->bigend).vect[2] = local_164.vect[2] + (in_RDI->bigend).vect[2];
      local_a8 = local_c0;
      local_98 = local_c0;
      local_88 = local_c0;
    }
  }
  Box::grow(in_RDI,1);
  return in_RDI;
}

Assistant:

Box
MFCellConsLinInterp::CoarseBox (const Box& fine, int ratio)
{
    Box crse = amrex::coarsen(fine,ratio);
    crse.grow(1);
    return crse;
}